

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

unique_ptr<Sock,_std::default_delete<Sock>_> CreateSockOS(int domain,int type,int protocol)

{
  bool bVar1;
  SOCKET s;
  int iVar2;
  Sock *this;
  Logger *this_00;
  int *piVar3;
  int in_ECX;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true> _Var4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  int on;
  undefined4 uStack_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30;
  
  _Var4.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl._4_4_ = in_register_0000003c;
  _Var4.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl._0_4_ = domain;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (type != 0) {
    s = socket(type,protocol,in_ECX);
    if (s != 0xffffffff) {
      this = (Sock *)operator_new(0x10);
      Sock::Sock(this,s);
      if (((uint)type < 0xb) && ((0x406U >> (type & 0x1fU) & 1) != 0)) {
        iVar2 = (*this->_vptr_Sock[0xd])(this);
        if ((char)iVar2 == '\0') {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
          ;
          source_file_00._M_len = 0x54;
          logging_function_00._M_str = "CreateSockOS";
          logging_function_00._M_len = 0xc;
          LogPrintf_<>(logging_function_00,source_file_00,0x20a,ALL,Info,
                       "Cannot create connection: non-selectable socket created (fd >= FD_SETSIZE ?)\n"
                      );
        }
        else {
          iVar2 = (*this->_vptr_Sock[0xc])(this);
          if ((char)iVar2 != '\0') {
            if ((type != 1) && (in_ECX == 6)) {
              on = 1;
              iVar2 = (*this->_vptr_Sock[10])(this,6,1,&on,4);
              if (iVar2 == -1) {
                this_00 = LogInstance();
                bVar1 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
                if (bVar1) {
                  source_file._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
                  ;
                  source_file._M_len = 0x54;
                  logging_function._M_str = "CreateSockOS";
                  logging_function._M_len = 0xc;
                  LogPrintf_<>(logging_function,source_file,0x226,NET,Debug,
                               "Unable to set TCP_NODELAY on a newly created socket, continuing anyway\n"
                              );
                }
              }
            }
            goto LAB_00d9be06;
          }
          piVar3 = __errno_location();
          NetworkErrorString_abi_cxx11_((string *)&on,*piVar3);
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
          ;
          source_file_01._M_len = 0x54;
          logging_function_01._M_str = "CreateSockOS";
          logging_function_01._M_len = 0xc;
          LogPrintf_<std::__cxx11::string>
                    (logging_function_01,source_file_01,0x21a,ALL,Info,
                     "Error setting socket to non-blocking: %s\n",(string *)&on);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_4c,on) != &local_40) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_4c,on),local_40._M_allocated_capacity + 1);
          }
        }
        *(undefined8 *)
         _Var4.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl = 0;
      }
      else {
LAB_00d9be06:
        *(Sock **)_Var4.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                  super__Head_base<0UL,_Sock_*,_false>._M_head_impl = this;
        this = (Sock *)0x0;
      }
      if (this != (Sock *)0x0) {
        (*this->_vptr_Sock[1])(this);
      }
      goto LAB_00d9bed8;
    }
  }
  *(undefined8 *)
   _Var4.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
   super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
   _M_head_impl = 0;
LAB_00d9bed8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (tuple<Sock_*,_std::default_delete<Sock>_>)
           _Var4.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> CreateSockOS(int domain, int type, int protocol)
{
    // Not IPv4, IPv6 or UNIX
    if (domain == AF_UNSPEC) return nullptr;

    // Create a socket in the specified address family.
    SOCKET hSocket = socket(domain, type, protocol);
    if (hSocket == INVALID_SOCKET) {
        return nullptr;
    }

    auto sock = std::make_unique<Sock>(hSocket);

    if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNIX) {
        return sock;
    }

    // Ensure that waiting for I/O on this socket won't result in undefined
    // behavior.
    if (!sock->IsSelectable()) {
        LogPrintf("Cannot create connection: non-selectable socket created (fd >= FD_SETSIZE ?)\n");
        return nullptr;
    }

#ifdef SO_NOSIGPIPE
    int set = 1;
    // Set the no-sigpipe option on the socket for BSD systems, other UNIXes
    // should use the MSG_NOSIGNAL flag for every send.
    if (sock->SetSockOpt(SOL_SOCKET, SO_NOSIGPIPE, (void*)&set, sizeof(int)) == SOCKET_ERROR) {
        LogPrintf("Error setting SO_NOSIGPIPE on socket: %s, continuing anyway\n",
                  NetworkErrorString(WSAGetLastError()));
    }
#endif

    // Set the non-blocking option on the socket.
    if (!sock->SetNonBlocking()) {
        LogPrintf("Error setting socket to non-blocking: %s\n", NetworkErrorString(WSAGetLastError()));
        return nullptr;
    }

#ifdef HAVE_SOCKADDR_UN
    if (domain == AF_UNIX) return sock;
#endif

    if (protocol == IPPROTO_TCP) {
        // Set the no-delay option (disable Nagle's algorithm) on the TCP socket.
        const int on{1};
        if (sock->SetSockOpt(IPPROTO_TCP, TCP_NODELAY, &on, sizeof(on)) == SOCKET_ERROR) {
            LogDebug(BCLog::NET, "Unable to set TCP_NODELAY on a newly created socket, continuing anyway\n");
        }
    }

    return sock;
}